

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# waveform_to_spectrum.cc
# Opt level: O1

void __thiscall
sptk::WaveformToSpectrum::WaveformToSpectrum
          (WaveformToSpectrum *this,int frame_length,int fft_length,InputOutputFormats output_format
          ,double epsilon,double relative_floor_in_decibels)

{
  pointer pdVar1;
  
  this->_vptr_WaveformToSpectrum = (_func_int **)&PTR__WaveformToSpectrum_0011a808;
  FilterCoefficientsToSpectrum::FilterCoefficientsToSpectrum
            (&this->filter_coefficients_to_spectrum_,frame_length + -1,0,fft_length,output_format,
             epsilon,relative_floor_in_decibels);
  (this->dummy_for_filter_coefficients_to_spectrum_).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->dummy_for_filter_coefficients_to_spectrum_).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->dummy_for_filter_coefficients_to_spectrum_).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pdVar1 = (pointer)operator_new(8);
  (this->dummy_for_filter_coefficients_to_spectrum_).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       pdVar1;
  (this->dummy_for_filter_coefficients_to_spectrum_).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       pdVar1;
  (this->dummy_for_filter_coefficients_to_spectrum_).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pdVar1 + 1;
  *pdVar1 = 1.0;
  (this->dummy_for_filter_coefficients_to_spectrum_).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       pdVar1 + 1;
  return;
}

Assistant:

WaveformToSpectrum::WaveformToSpectrum(
    int frame_length, int fft_length,
    SpectrumToSpectrum::InputOutputFormats output_format, double epsilon,
    double relative_floor_in_decibels)
    : filter_coefficients_to_spectrum_(frame_length - 1, 0, fft_length,
                                       output_format, epsilon,
                                       relative_floor_in_decibels),
      dummy_for_filter_coefficients_to_spectrum_(1, 1.0) {
}